

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O3

Vector * noise_3d(Vector *__return_storage_ptr__,Vector *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  double *pdVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  ulong uVar67;
  uint uVar68;
  ulong uVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dStack_a0;
  
  pdVar59 = noise_table;
  dVar89 = p->x + 10000.0;
  dVar81 = p->y + 10000.0;
  dVar88 = p->z + 10000.0;
  Noise3dCalls = Noise3dCalls + 1;
  lVar60 = (long)dVar89;
  lVar71 = (long)dVar81;
  lVar66 = (long)dVar88;
  dVar75 = dVar89 - (double)lVar60;
  dVar76 = (3.0 - (dVar75 + dVar75)) * dVar75 * dVar75;
  dVar74 = dVar81 - (double)lVar71;
  dVar87 = dVar88 - (double)lVar66;
  uVar70 = (uint)lVar71 & 0xfff;
  uVar65 = (uint)lVar66 & 0xfff;
  uVar64 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(hash_table[(uint)lVar60 & 0xfff] ^ uVar70)] ^
                                uVar65));
  dVar1 = noise_table[uVar64 + 0xb];
  uVar72 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(uVar70 ^ hash_table[(uint)(lVar60 + 1) & 0xfff])]
                                ^ uVar65));
  dVar2 = noise_table[uVar72 + 0xb];
  dVar3 = noise_table[uVar64 + 9];
  dVar4 = noise_table[uVar64 + 8];
  dVar5 = noise_table[uVar64 + 10];
  dVar6 = noise_table[uVar64 + 5];
  dVar89 = dVar89 - (double)(lVar60 + 1);
  dVar7 = noise_table[uVar72 + 5];
  dVar8 = noise_table[uVar72 + 9];
  dVar9 = noise_table[uVar72 + 8];
  dVar10 = noise_table[uVar72 + 10];
  uVar68 = (uint)(lVar71 + 1) & 0xfff;
  uVar73 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(hash_table[(uint)(lVar60 + 1) & 0xfff] ^ uVar68)]
                                ^ uVar65));
  dVar81 = dVar81 - (double)(lVar71 + 1);
  dVar11 = noise_table[uVar73 + 9];
  dVar12 = noise_table[uVar73 + 8];
  dVar13 = noise_table[uVar73 + 10];
  dVar14 = noise_table[uVar73 + 0xb];
  uVar62 = (ulong)*(byte *)(hash_table +
                           (int)(uVar65 ^ hash_table
                                          [(int)(uVar68 ^ hash_table[(uint)lVar60 & 0xfff])]));
  dVar15 = noise_table[uVar62 + 9];
  dVar16 = noise_table[uVar62 + 8];
  dVar17 = noise_table[uVar62 + 10];
  dVar18 = noise_table[uVar62 + 0xb];
  dVar88 = dVar88 - (double)(lVar66 + 1);
  uVar65 = (uint)(lVar66 + 1) & 0xfff;
  uVar69 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(uVar68 ^ hash_table[(uint)lVar60 & 0xfff])] ^
                                uVar65));
  dVar19 = noise_table[uVar69 + 9];
  dVar20 = noise_table[uVar69 + 8];
  dVar21 = noise_table[uVar69 + 10];
  dVar22 = noise_table[uVar69 + 0xb];
  uVar67 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(hash_table[(uint)(lVar60 + 1) & 0xfff] ^ uVar68)]
                                ^ uVar65));
  dVar23 = noise_table[uVar67 + 9];
  dVar24 = noise_table[uVar67 + 8];
  dVar25 = noise_table[uVar67 + 10];
  dVar26 = noise_table[uVar67 + 0xb];
  uVar63 = (ulong)*(byte *)(hash_table +
                           (int)(hash_table[(int)(uVar70 ^ hash_table[(uint)(lVar60 + 1) & 0xfff])]
                                ^ uVar65));
  dVar27 = noise_table[uVar63 + 9];
  dVar28 = noise_table[uVar63 + 8];
  dVar29 = noise_table[uVar63 + 10];
  dVar30 = noise_table[uVar63 + 0xb];
  dVar31 = noise_table[uVar64 + 4];
  dVar32 = noise_table[uVar64 + 6];
  dVar33 = noise_table[uVar64 + 7];
  dVar34 = noise_table[uVar72 + 4];
  dVar35 = noise_table[uVar72 + 6];
  dVar36 = noise_table[uVar72 + 7];
  dVar37 = noise_table[uVar73 + 5];
  dVar38 = noise_table[uVar73 + 4];
  dVar39 = noise_table[uVar73 + 6];
  dVar40 = noise_table[uVar73 + 7];
  dVar85 = (3.0 - (dVar74 + dVar74)) * dVar74 * dVar74;
  dVar82 = (1.0 - dVar76) * dVar85;
  dVar83 = (3.0 - (dVar87 + dVar87)) * dVar87 * dVar87;
  dVar84 = dVar76 * (1.0 - dVar85);
  dVar79 = (1.0 - dVar85) * (1.0 - dVar76);
  auVar58._8_4_ = SUB84(dVar79,0);
  auVar58._0_8_ = dVar84;
  auVar58._12_4_ = (int)((ulong)dVar79 >> 0x20);
  dVar80 = 1.0 - dVar83;
  dVar78 = dVar80 * dVar84;
  dVar79 = dVar80 * dVar79;
  dVar77 = dVar85 * dVar76 * dVar80;
  dVar41 = noise_table[uVar62 + 5];
  dVar42 = noise_table[uVar62 + 4];
  dVar43 = noise_table[uVar62 + 6];
  dVar44 = noise_table[uVar62 + 7];
  dVar80 = dVar80 * dVar82;
  dVar45 = noise_table[uVar69 + 5];
  dVar46 = noise_table[uVar69 + 4];
  dVar47 = noise_table[uVar69 + 6];
  dVar48 = noise_table[uVar69 + 7];
  dVar82 = dVar82 * dVar83;
  dVar86 = dVar85 * dVar76 * dVar83;
  dVar76 = noise_table[uVar67 + 5];
  dVar85 = noise_table[uVar67 + 4];
  dVar49 = noise_table[uVar67 + 6];
  dVar50 = noise_table[uVar67 + 7];
  dVar51 = noise_table[uVar63 + 5];
  dVar52 = noise_table[uVar63 + 4];
  dVar53 = noise_table[uVar63 + 6];
  dStack_a0 = auVar58._8_8_;
  dVar84 = dVar83 * dVar84;
  dVar54 = noise_table[uVar63 + 7];
  uVar61 = (ulong)*(byte *)(hash_table +
                           (int)(uVar65 ^ hash_table
                                          [(int)(hash_table[(uint)lVar60 & 0xfff] ^ uVar70)]));
  dStack_a0 = dStack_a0 * dVar83;
  dVar83 = noise_table[uVar61 + 5];
  dVar55 = noise_table[uVar61 + 4];
  dVar56 = noise_table[uVar61 + 6];
  dVar57 = noise_table[uVar61 + 7];
  __return_storage_ptr__->x =
       (noise_table[uVar61 + 3] * dVar88 +
       noise_table[uVar61 + 2] * dVar74 +
       noise_table[uVar61] * 0.5 + noise_table[uVar61 + 1] * dVar75) * dStack_a0 +
       dVar84 * (noise_table[uVar63 + 3] * dVar88 +
                noise_table[uVar63 + 2] * dVar74 +
                noise_table[uVar63] * 0.5 + noise_table[uVar63 + 1] * dVar89) +
       dVar86 * (noise_table[uVar67 + 3] * dVar88 +
                noise_table[uVar67 + 2] * dVar81 +
                noise_table[uVar67] * 0.5 + noise_table[uVar67 + 1] * dVar89) +
       dVar82 * (noise_table[uVar69 + 3] * dVar88 +
                noise_table[uVar69 + 2] * dVar81 +
                noise_table[uVar69] * 0.5 + noise_table[uVar69 + 1] * dVar75) +
       dVar80 * (noise_table[uVar62 + 3] * dVar87 +
                noise_table[uVar62 + 2] * dVar81 +
                noise_table[uVar62] * 0.5 + noise_table[uVar62 + 1] * dVar75) +
       dVar77 * (noise_table[uVar73 + 3] * dVar87 +
                noise_table[uVar73 + 2] * dVar81 +
                noise_table[uVar73] * 0.5 + noise_table[uVar73 + 1] * dVar89) +
       dVar79 * (noise_table[uVar64 + 3] * dVar87 +
                noise_table[uVar64 + 2] * dVar74 +
                noise_table[uVar64] * 0.5 + noise_table[uVar64 + 1] * dVar75) +
       (noise_table[uVar72 + 3] * dVar87 +
       noise_table[uVar72 + 2] * dVar74 +
       noise_table[uVar72] * 0.5 + noise_table[uVar72 + 1] * dVar89) * dVar78;
  __return_storage_ptr__->y =
       (dVar57 * dVar88 + dVar56 * dVar74 + dVar55 * 0.5 + dVar83 * dVar75) * dStack_a0 +
       dVar84 * (dVar54 * dVar88 + dVar53 * dVar74 + dVar52 * 0.5 + dVar51 * dVar89) +
       dVar86 * (dVar50 * dVar88 + dVar49 * dVar81 + dVar85 * 0.5 + dVar76 * dVar89) +
       dVar82 * (dVar48 * dVar88 + dVar47 * dVar81 + dVar46 * 0.5 + dVar45 * dVar75) +
       dVar80 * (dVar44 * dVar87 + dVar43 * dVar81 + dVar42 * 0.5 + dVar41 * dVar75) +
       dVar77 * (dVar40 * dVar87 + dVar39 * dVar81 + dVar38 * 0.5 + dVar37 * dVar89) +
       dVar78 * (dVar36 * dVar87 + dVar35 * dVar74 + dVar34 * 0.5 + dVar7 * dVar89) +
       (dVar33 * dVar87 + dVar32 * dVar74 + dVar31 * 0.5 + dVar6 * dVar75) * dVar79;
  __return_storage_ptr__->z =
       (dVar88 * pdVar59[uVar61 + 0xb] +
       dVar74 * pdVar59[uVar61 + 10] + pdVar59[uVar61 + 8] * 0.5 + dVar75 * pdVar59[uVar61 + 9]) *
       dStack_a0 +
       dVar84 * (dVar30 * dVar88 + dVar29 * dVar74 + dVar28 * 0.5 + dVar27 * dVar89) +
       dVar82 * (dVar22 * dVar88 + dVar21 * dVar81 + dVar20 * 0.5 + dVar19 * dVar75) +
       dVar80 * (dVar18 * dVar87 + dVar17 * dVar81 + dVar16 * 0.5 + dVar15 * dVar75) +
       dVar78 * (dVar2 * dVar87 + dVar10 * dVar74 + dVar9 * 0.5 + dVar8 * dVar89) +
       dVar79 * (dVar1 * dVar87 + dVar5 * dVar74 + dVar4 * 0.5 + dVar3 * dVar75) +
       (dVar14 * dVar87 + dVar13 * dVar81 + dVar12 * 0.5 + dVar11 * dVar89) * dVar77 +
       (dVar26 * dVar88 + dVar25 * dVar81 + dVar24 * 0.5 + dVar23 * dVar89) * dVar86;
  return __return_storage_ptr__;
}

Assistant:

Vector noise_3d( const Vector& p )
{
   double sx,sy,sz,tx,ty,tz;
   long ix,iy,iz,jx,jy,jz;
   double s, px, py, pz;
   int   m;
   Vector result (0);
   Vector v = p;

   Noise3dCalls++;

   setup_lattice(v,ix,iy,iz,jx,jy,jz,sx,sy,sz,tx,ty,tz);

   double x = v.x;
   double y = v.y;
   double z = v.z;
   //
   // Interpolate
   //
   m =   HASH( ix, iy, iz ) & 0xFF;
   px = x-ix;  py = y-iy;  pz = z-iz;
   s =   tx*ty*tz;
   result.x = INCRSUM(m,s,px,py,pz);
   result.y = INCRSUM(m+4,s,px,py,pz);
   result.z = INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, iz ) & 0xFF;
   px = x-jx;
   s =   sx*ty*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, iz ) & 0xFF;
   py = y-jy;
   s =   sx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, iz ) & 0xFF;
   px = x-ix;
   s =   tx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, jz ) & 0xFF;
   pz = z-jz;
   s =   tx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, jz ) & 0xFF;
   px = x-jx;
   s =   sx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, jz ) & 0xFF;
   py = y-iy;
   s =   sx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, iy, jz ) & 0xFF;
   px = x-ix;
   s =   tx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

// DEBUG
// printf("Noise3D: result == <%g %g %g>\n",result.x,result.y,result.z);
   return result;
}